

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_test.cxx
# Opt level: O2

void __thiscall vector_digest_test::test_method(vector_digest_test *this)

{
  initializer_list<char> __l;
  string str;
  vector<char,_std::allocator<char>_> vector;
  char *local_70;
  char *local_68;
  undefined **local_60;
  undefined1 local_58;
  undefined8 *local_50;
  char *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_30;
  char *local_28;
  digest_type hash;
  
  str._M_dataplus._M_p._0_4_ = 0x4030201;
  __l._M_len = 4;
  __l._M_array = (iterator)&str;
  std::vector<char,_std::allocator<char>_>::vector(&vector,__l,(allocator_type *)&local_60);
  hash._M_elems =
       (_Type)cryptox::
              digest<cryptox::message_digest_algorithm<&EVP_md5,128ul>,std::vector<char,std::allocator<char>>>
                        (&vector);
  cryptox::to_hex<std::array<unsigned_char,16ul>>(&str,(cryptox *)&hash,hash._M_elems._8_8_);
  local_30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
  ;
  local_28 = "";
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_30,0x32);
  local_58 = 0;
  local_60 = &PTR__lazy_ostream_002b7238;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = "";
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/digest_test.cxx"
  ;
  local_68 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[33]>
            (&local_60,&local_70,0x32,1,2,&str,"str","08d6c05a21512a79a1dfeb9d2a8f262f",
             "\"08d6c05a21512a79a1dfeb9d2a8f262f\"");
  std::__cxx11::string::~string((string *)&str);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&vector.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(vector_digest_test) {
	const std::vector<char> vector = { 1, 2, 3, 4 };
	const md5::digest_type hash = digest<md5>(vector);
	const std::string str = to_hex(hash);
	BOOST_CHECK_EQUAL(str, "08d6c05a21512a79a1dfeb9d2a8f262f");
}